

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

longlong kj::anon_unknown_55::parseSigned(StringPtr *s,longlong min,longlong max)

{
  char *__nptr;
  ulong uVar1;
  StringPtr *pSVar2;
  int __base;
  Fault *this;
  bool bVar3;
  Fault f_1;
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> _kjCondition;
  longlong value;
  longlong max_local;
  longlong min_local;
  char *endPtr;
  
  this = &f_1;
  bVar3 = (s->content).size_ < 2;
  _kjCondition.result = !bVar3;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = s;
  max_local = max;
  min_local = min;
  if (bVar3) {
    this = (Fault *)&endPtr;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr_const&,decltype(nullptr)>&,char_const(&)[37],kj::StringPtr_const&>
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x2a,FAILED,"s != nullptr",
               "_kjCondition,\"String does not contain valid number\", s",&_kjCondition,
               (char (*) [37])"String does not contain valid number",s);
  }
  else {
    pSVar2 = (StringPtr *)__errno_location();
    *(int *)&(pSVar2->content).ptr = 0;
    __nptr = (s->content).ptr;
    __base = 10;
    if (__nptr[*__nptr == '-'] == '0') {
      __base = 10;
      if ((__nptr[(ulong)(*__nptr == '-') + 1] & 0xdfU) == 0x58) {
        __base = 0x10;
      }
    }
    value = strtoll(__nptr,&endPtr,__base);
    _kjCondition.right = (s->content).ptr + ((s->content).size_ - 1);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.result = endPtr == (char *)_kjCondition.right;
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      _kjCondition.result = *(int *)&(pSVar2->content).ptr != 0x22;
      uVar1 = (ulong)_kjCondition.right >> 0x20;
      _kjCondition.right = (void *)CONCAT44((int)uVar1,0x22);
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.left = pSVar2;
      if (_kjCondition.result) {
        f_1.exception._0_1_ = value <= max_local && min_local <= value;
        if (value <= max_local && min_local <= value) {
          return value;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[19],long_long&,long_long&,long_long&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                   ,0x30,FAILED,"value >= min && value <= max",
                   "_kjCondition,\"Value out-of-range\", value, min, max",(bool *)&f_1,
                   (char (*) [19])"Value out-of-range",&value,&min_local,&max_local);
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        return 0;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[19],kj::StringPtr_const&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x2f,FAILED,"errno != ERANGE","_kjCondition,\"Value out-of-range\", s",
                 (DebugComparison<int_&,_int> *)&_kjCondition,(char (*) [19])"Value out-of-range",s)
      ;
    }
    else {
      _kjCondition.left = (StringPtr *)&endPtr;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[37],kj::StringPtr_const&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x2e,FAILED,"endPtr == s.end()",
                 "_kjCondition,\"String does not contain valid number\", s",
                 (DebugComparison<char_*&,_const_char_*> *)&_kjCondition,
                 (char (*) [37])"String does not contain valid number",s);
      this = &f_1;
    }
  }
  kj::_::Debug::Fault::~Fault(this);
  return 0;
}

Assistant:

long long parseSigned(const StringPtr& s, long long min, long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value >= min && value <= max, "Value out-of-range", value, min, max) { return 0; }
  return value;
}